

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O1

int Curl_wait_ms(int timeout_ms)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  timediff_t tVar4;
  int iVar5;
  curltime cVar6;
  curltime cVar7;
  curltime newer;
  
  if (timeout_ms == 0) {
    iVar5 = 0;
  }
  else if (timeout_ms < 0) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    iVar5 = -1;
  }
  else {
    cVar6 = Curl_now();
    iVar5 = timeout_ms;
    do {
      bVar1 = false;
      iVar2 = poll((pollfd *)0x0,0,iVar5);
      if (iVar2 == -1) {
        piVar3 = __errno_location();
        if (*piVar3 != 0) {
          bVar1 = false;
          iVar2 = -1;
          if ((*piVar3 != 4) || (Curl_ack_eintr != 0)) goto LAB_00480170;
        }
        cVar7 = Curl_now();
        newer._12_4_ = 0;
        newer.tv_sec = SUB128(cVar7._0_12_,0);
        newer.tv_usec = SUB124(cVar7._0_12_,8);
        cVar7._12_4_ = 0;
        cVar7.tv_sec = SUB128(cVar6._0_12_,0);
        cVar7.tv_usec = SUB124(cVar6._0_12_,8);
        tVar4 = Curl_timediff(newer,cVar7);
        iVar5 = timeout_ms - (int)tVar4;
        bVar1 = iVar5 != 0 && (int)tVar4 <= timeout_ms;
        iVar2 = -(uint)bVar1;
      }
LAB_00480170:
    } while ((bVar1) && (iVar2 == -1));
    iVar5 = -(uint)(iVar2 != 0);
  }
  return iVar5;
}

Assistant:

int Curl_wait_ms(int timeout_ms)
{
#if !defined(MSDOS) && !defined(USE_WINSOCK)
#ifndef HAVE_POLL_FINE
  struct timeval pending_tv;
#endif
  struct curltime initial_tv;
  int pending_ms;
#endif
  int r = 0;

  if(!timeout_ms)
    return 0;
  if(timeout_ms < 0) {
    SET_SOCKERRNO(EINVAL);
    return -1;
  }
#if defined(MSDOS)
  delay(timeout_ms);
#elif defined(USE_WINSOCK)
  Sleep(timeout_ms);
#else
  pending_ms = timeout_ms;
  initial_tv = Curl_now();
  do {
    int error;
#if defined(HAVE_POLL_FINE)
    r = poll(NULL, 0, pending_ms);
#else
    pending_tv.tv_sec = pending_ms / 1000;
    pending_tv.tv_usec = (pending_ms % 1000) * 1000;
    r = select(0, NULL, NULL, NULL, &pending_tv);
#endif /* HAVE_POLL_FINE */
    if(r != -1)
      break;
    error = SOCKERRNO;
    if(error && ERROR_NOT_EINTR(error))
      break;
    pending_ms = timeout_ms - ELAPSED_MS();
    if(pending_ms <= 0) {
      r = 0;  /* Simulate a "call timed out" case */
      break;
    }
  } while(r == -1);
#endif /* USE_WINSOCK */
  if(r)
    r = -1;
  return r;
}